

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddPchDependencies(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  string *language_00;
  cmTarget *pcVar1;
  cmMakefile *pcVar2;
  string *psVar3;
  pointer pbVar4;
  __type _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  TargetType TVar11;
  cmValue cVar12;
  cmValue name;
  cmSourceFile *pcVar13;
  cmGeneratorTarget *reuseTarget;
  string *psVar14;
  iterator iVar15;
  ostream *poVar16;
  long lVar17;
  cmAlphaNum *this_00;
  pointer ppcVar18;
  ulong uVar19;
  pointer arch;
  pointer config;
  long lVar20;
  pointer ppcVar21;
  string *arch_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view source;
  string pchHeader_1;
  string err;
  string useMultiArchPch;
  string pchSourceObj;
  string linkerProperty;
  string compilerVersion;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string pchHeader_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchLangSet;
  string local_298;
  string pchFile;
  string configUpper;
  string local_238;
  _Optional_payload_base<cmListFileBacktrace> local_218;
  string local_200 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configsList;
  string pchHeader;
  string local_1a8 [344];
  string local_50;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configsList,this->Makefile,IncludeEmptyConfig);
  for (config = configsList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      config != configsList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetSourceFiles(target,&sources,config);
    cmsys::SystemTools::UpperCase(&configUpper,config);
    if ((AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_ == '\0') &&
       (iVar10 = __cxa_guard_acquire(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_),
       iVar10 != 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,"C",
                 (allocator<char> *)&pchHeader);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 1),
                 "CXX",(allocator<char> *)&pchLangSet);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 2),
                 "OBJC",(allocator<char> *)&err);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 3),
                 "OBJCXX",(allocator<char> *)&pchHeader_1);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   ::~array,&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
    }
    pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header;
    pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         pchLangSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar10 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar10 != '\0') {
      for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&pchHeader_1);
        language = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                           _M_dataplus._M_p + lVar20);
        cmGeneratorTarget::GetPchHeader(&pchHeader,target,config,language,&err);
        std::__cxx11::string::~string((string *)&err);
        if (pchHeader._M_string_length != 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&pchLangSet,language);
        }
        std::__cxx11::string::~string((string *)&pchHeader);
      }
    }
    for (lVar20 = 0;
        ppcVar18 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        ppcVar21 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start, lVar20 != 0x80; lVar20 = lVar20 + 0x20)
    {
      language_00 = (string *)
                    ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                            _M_dataplus._M_p + lVar20);
      std::__cxx11::string::string(local_200,(string *)language_00);
      std::__cxx11::string::string((string *)&compilerVersion,local_200);
      std::__cxx11::string::string((string *)&pchHeader,(string *)&compilerVersion);
      std::__cxx11::string::string((string *)&pchHeader_1,(string *)&pchHeader);
      std::__cxx11::string::~string((string *)&pchHeader);
      lVar17 = 0;
      for (; ppcVar21 != ppcVar18; ppcVar21 = ppcVar21 + 1) {
        pcVar13 = *ppcVar21;
        cmSourceFile::GetLanguage_abi_cxx11_(&pchHeader,pcVar13);
        _Var5 = std::operator==(&pchHeader_1,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pchHeader);
        if (_Var5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"SKIP_PRECOMPILE_HEADERS",(allocator<char> *)&useMultiArchPch);
          cVar12 = cmSourceFile::GetProperty(pcVar13,&err);
          uVar19 = (ulong)(cVar12.Value == (string *)0x0);
          std::__cxx11::string::~string((string *)&err);
        }
        else {
          uVar19 = 0;
        }
        std::__cxx11::string::~string((string *)&pchHeader);
        lVar17 = lVar17 + uVar19;
      }
      std::__cxx11::string::~string((string *)&pchHeader_1);
      std::__cxx11::string::~string((string *)&compilerVersion);
      std::__cxx11::string::~string(local_200);
      if (lVar17 != 0) {
        architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        iVar10 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
        if ((char)iVar10 == '\0') {
          cmGeneratorTarget::GetAppleArchs(target,config,&architectures);
        }
        pbVar4 = architectures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(&architectures);
          arch_00 = architectures.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar3 = architectures.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          useMultiArchPch._M_dataplus._M_p = (pointer)&useMultiArchPch.field_2;
          useMultiArchPch._M_string_length = 0;
          useMultiArchPch.field_2._M_local_buf[0] = '\0';
          for (arch = architectures.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; arch != pbVar4; arch = arch + 1) {
            cmGeneratorTarget::GetPchHeader(&pchHeader_1,target,config,language_00,arch);
            if (pchHeader_1._M_string_length != 0) {
              pchHeader._M_dataplus._M_p = (pointer)useMultiArchPch._M_string_length;
              pchHeader._M_string_length = (size_type)useMultiArchPch._M_dataplus._M_p;
              err._M_dataplus._M_p = (pointer)0x8;
              err._M_string_length = (size_type)anon_var_dwarf_132a70e;
              cmStrCat<std::__cxx11::string,char[10],std::__cxx11::string>
                        (&compilerVersion,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err,arch,
                         (char (*) [10])";-include",&pchHeader_1);
              std::__cxx11::string::operator=((string *)&useMultiArchPch,(string *)&compilerVersion)
              ;
              std::__cxx11::string::~string((string *)&compilerVersion);
            }
            std::__cxx11::string::~string((string *)&pchHeader_1);
          }
          if (useMultiArchPch._M_string_length != 0) {
            pcVar1 = target->Target;
            pchHeader._M_string_length = (size_type)(language_00->_M_dataplus)._M_p;
            pchHeader._M_dataplus._M_p =
                 *(pointer *)
                  ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                          _M_string_length + lVar20);
            err._M_dataplus._M_p = &DAT_00000018;
            err._M_string_length = (size_type)anon_var_dwarf_109546f;
            cmStrCat<>(&pchHeader_2,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err);
            pchHeader_1._M_dataplus._M_p = &DAT_0000000b;
            pchHeader_1._M_string_length = (long)"\"$<$<CONFIG:" + 1;
            compilerVersion._M_string_length = (size_type)(config->_M_dataplus)._M_p;
            compilerVersion._M_dataplus._M_p = (pointer)config->_M_string_length;
            cmStrCat<char[3],std::__cxx11::string,char[2]>
                      (&pchFile,(cmAlphaNum *)&pchHeader_1,(cmAlphaNum *)&compilerVersion,
                       (char (*) [3])">:",&useMultiArchPch,(char (*) [2])0x695931);
            pchSourceObj.field_2._M_local_buf[0] = '\0';
            cmTarget::AppendProperty
                      (pcVar1,&pchHeader_2,&pchFile,(optional<cmListFileBacktrace> *)&pchSourceObj,
                       false);
            std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
                      ((_Optional_payload_base<cmListFileBacktrace> *)&pchSourceObj);
            std::__cxx11::string::~string((string *)&pchFile);
            std::__cxx11::string::~string((string *)&pchHeader_2);
          }
          std::__cxx11::string::~string((string *)&useMultiArchPch);
          arch_00 = architectures.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar3 = architectures.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; arch_00 != psVar3; arch_00 = arch_00 + 1) {
          cmGeneratorTarget::GetPchSource(&useMultiArchPch,target,config,language_00,arch_00);
          cmGeneratorTarget::GetPchHeader(&pchHeader_2,target,config,language_00,arch_00);
          if ((useMultiArchPch._M_string_length == 0) || (pchHeader_2._M_string_length == 0)) {
            iVar10 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
            ppcVar21 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            ppcVar18 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if (((byte)iVar10 & pchLangSet._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ==
                1) {
              for (; ppcVar18 != ppcVar21; ppcVar18 = ppcVar18 + 1) {
                pcVar13 = *ppcVar18;
                cmSourceFile::GetLanguage_abi_cxx11_(&pchHeader,pcVar13);
                if ((pchHeader._M_string_length != 0) &&
                   (iVar15 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::find(&pchLangSet._M_t,(key_type *)&pchHeader),
                   (_Rb_tree_header *)iVar15._M_node ==
                   &pchLangSet._M_t._M_impl.super__Rb_tree_header)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err,"SKIP_PRECOMPILE_HEADERS",
                             (allocator<char> *)&pchHeader_1);
                  cmSourceFile::SetProperty(pcVar13,&err,"ON");
                  std::__cxx11::string::~string((string *)&err);
                }
                std::__cxx11::string::~string((string *)&pchHeader);
              }
            }
          }
          else {
            pcVar2 = this->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&pchHeader,"CMAKE_PCH_EXTENSION",(allocator<char> *)&err);
            cVar12 = cmMakefile::GetDefinition(pcVar2,&pchHeader);
            std::__cxx11::string::~string((string *)&pchHeader);
            if ((cVar12.Value != (string *)0x0) && ((cVar12.Value)->_M_string_length != 0)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&pchHeader,"PRECOMPILE_HEADERS_REUSE_FROM",
                         (allocator<char> *)&err);
              name = cmGeneratorTarget::GetProperty(target,&pchHeader);
              std::__cxx11::string::~string((string *)&pchHeader);
              pcVar13 = cmMakefile::GetOrCreateSource(this->Makefile,&useMultiArchPch,false,Known);
              iVar10 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
              if ((char)iVar10 == '\0') {
                if (name.Value == (string *)0x0) {
                  cmGeneratorTarget::AddSource(target,&useMultiArchPch,true);
                }
                cmGeneratorTarget::GetPchFile(&pchFile,target,config,language_00,arch_00);
                pcVar2 = this->Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&pchHeader,"CMAKE_LINK_PCH",(allocator<char> *)&err);
                bVar6 = cmMakefile::IsOn(pcVar2,&pchHeader);
                std::__cxx11::string::~string((string *)&pchHeader);
                if (bVar6) {
                  if (name.Value == (string *)0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&pchHeader_1,"OBJECT_OUTPUTS",
                               (allocator<char> *)&pchSourceObj);
                    pchHeader._M_dataplus._M_p = &DAT_0000000b;
                    pchHeader._M_string_length = (long)"\"$<$<CONFIG:" + 1;
                    err._M_string_length = (size_type)(config->_M_dataplus)._M_p;
                    err._M_dataplus._M_p = (pointer)config->_M_string_length;
                    cmStrCat<char[3],std::__cxx11::string,char[2]>
                              (&compilerVersion,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err,
                               (char (*) [3])">:",&pchFile,(char (*) [2])0x695931);
                    cmSourceFile::AppendProperty(pcVar13,&pchHeader_1,&compilerVersion,false);
                    std::__cxx11::string::~string((string *)&compilerVersion);
                    this_00 = (cmAlphaNum *)&pchHeader_1;
                  }
                  else {
                    reuseTarget = cmGlobalGenerator::FindGeneratorTarget
                                            (this->GlobalGenerator,name.Value);
                    pcVar2 = this->Makefile;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&pchHeader,"CMAKE_PCH_COPY_COMPILE_PDB",
                               (allocator<char> *)&err);
                    bVar6 = cmMakefile::IsOn(pcVar2,&pchHeader);
                    std::__cxx11::string::~string((string *)&pchHeader);
                    if (bVar6) {
                      pcVar2 = this->Makefile;
                      pchHeader._M_dataplus._M_p = &DAT_00000006;
                      pchHeader._M_string_length = (long)"The CMAKE_" + 4;
                      err._M_string_length = (size_type)(language_00->_M_dataplus)._M_p;
                      err._M_dataplus._M_p =
                           *(pointer *)
                            ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_.
                                    _M_elems[0]._M_string_length + lVar20);
                      cmStrCat<char[13]>(&compilerVersion,(cmAlphaNum *)&pchHeader,
                                         (cmAlphaNum *)&err,(char (*) [13])0x66164b);
                      psVar14 = cmMakefile::GetSafeDefinition(pcVar2,&compilerVersion);
                      std::__cxx11::string::string((string *)&pchHeader_1,(string *)psVar14);
                      std::__cxx11::string::~string((string *)&compilerVersion);
                      pcVar2 = this->Makefile;
                      pchHeader._M_dataplus._M_p = &DAT_00000006;
                      pchHeader._M_string_length = (long)"The CMAKE_" + 4;
                      err._M_string_length = (size_type)(language_00->_M_dataplus)._M_p;
                      err._M_dataplus._M_p =
                           *(pointer *)
                            ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_.
                                    _M_elems[0]._M_string_length + lVar20);
                      cmStrCat<char[18]>(&pchSourceObj,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err,
                                         (char (*) [18])0x675897);
                      psVar14 = cmMakefile::GetSafeDefinition(pcVar2,&pchSourceObj);
                      std::__cxx11::string::string((string *)&compilerVersion,(string *)psVar14);
                      std::__cxx11::string::~string((string *)&pchSourceObj);
                      pcVar2 = this->Makefile;
                      pchHeader._M_dataplus._M_p = &DAT_00000006;
                      pchHeader._M_string_length = (long)"The CMAKE_" + 4;
                      err._M_string_length = (size_type)(language_00->_M_dataplus)._M_p;
                      err._M_dataplus._M_p =
                           *(pointer *)
                            ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_.
                                    _M_elems[0]._M_string_length + lVar20);
                      cmStrCat<char[8],std::__cxx11::string>
                                (&linkerProperty,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err,
                                 (char (*) [8])0x660a24,&configUpper);
                      psVar14 = cmMakefile::GetSafeDefinition(pcVar2,&linkerProperty);
                      std::__cxx11::string::string((string *)&pchSourceObj,(string *)psVar14);
                      std::__cxx11::string::~string((string *)&linkerProperty);
                      GetMSVCDebugFormatName
                                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&pchHeader,this,config,target);
                      if (local_1a8[0] == (string)0x1) {
                        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&pchHeader,"EditAndContinue");
                        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&pchHeader,"ProgramDatabase");
                      }
                      else {
                        lVar17 = std::__cxx11::string::find((char *)&pchSourceObj,0x67cd66);
                        bVar7 = true;
                        bVar6 = true;
                        if (lVar17 == -1) {
                          lVar17 = std::__cxx11::string::find((char *)&pchSourceObj,0x67cd6a);
                          bVar6 = lVar17 != -1;
                        }
                        lVar17 = std::__cxx11::string::find((char *)&pchSourceObj,0x67cd6e);
                        if (lVar17 == -1) {
                          lVar17 = std::__cxx11::string::find((char *)&pchSourceObj,0x67cd72);
                          bVar7 = lVar17 != -1;
                        }
                      }
                      std::
                      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&pchHeader);
                      bVar8 = cmSystemTools::VersionCompare(OP_LESS,&compilerVersion,"16.0");
                      if (bVar8) {
                        bVar8 = std::operator==(&pchHeader_1,"MSVC");
                      }
                      else {
                        bVar8 = false;
                      }
                      pcVar2 = this->Makefile;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&pchHeader,"CMAKE_VS_PLATFORM_TOOLSET",
                                 (allocator<char> *)&err);
                      psVar14 = cmMakefile::GetSafeDefinition(pcVar2,&pchHeader);
                      bVar9 = std::operator==(psVar14,"v90");
                      std::__cxx11::string::~string((string *)&pchHeader);
                      if (bVar6 == false && (bVar8 & !bVar9) == 0) {
                        if (bVar7 != false) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&pchHeader,".pdb",(allocator<char> *)&linkerProperty)
                          ;
                          __l_00._M_len = 1;
                          __l_00._M_array = (iterator)&pchHeader;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&err,__l_00,(allocator_type *)&local_298);
                          CopyPchCompilePdb(this,config,target,name.Value,reuseTarget,
                                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&err);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&err);
                          std::__cxx11::string::~string((string *)&pchHeader);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&pchHeader,".pdb",(allocator<char> *)&linkerProperty);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_1a8,".idb",(allocator<char> *)&local_298);
                        __l._M_len = 2;
                        __l._M_array = (iterator)&pchHeader;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&err,__l,(allocator_type *)&local_50);
                        CopyPchCompilePdb(this,config,target,name.Value,reuseTarget,
                                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&err);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&err);
                        lVar17 = 0x20;
                        do {
                          std::__cxx11::string::~string(local_1a8 + lVar17 + -0x20);
                          lVar17 = lVar17 + -0x20;
                        } while (lVar17 != -0x20);
                      }
                      std::__cxx11::string::~string((string *)&pchSourceObj);
                      std::__cxx11::string::~string((string *)&compilerVersion);
                      std::__cxx11::string::~string((string *)&pchHeader_1);
                    }
                    cmGeneratorTarget::GetPchFileObject
                              (&pchSourceObj,reuseTarget,config,language_00,arch_00);
                    TVar11 = cmGeneratorTarget::GetType(target);
                    if (TVar11 == OBJECT_LIBRARY) {
                      TVar11 = cmGeneratorTarget::GetType(reuseTarget);
                      if (TVar11 == OBJECT_LIBRARY) {
                        pcVar1 = target->Target;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&pchHeader_1,"INTERFACE_LINK_LIBRARIES",
                                   (allocator<char> *)&local_298);
                        pchHeader._M_dataplus._M_p = &DAT_0000000b;
                        pchHeader._M_string_length = (long)"\"$<$<CONFIG:" + 1;
                        err._M_string_length = (size_type)(config->_M_dataplus)._M_p;
                        err._M_dataplus._M_p = (pointer)config->_M_string_length;
                        cmStrCat<char[15],std::__cxx11::string,char[3]>
                                  (&compilerVersion,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err,
                                   (char (*) [15])">:$<LINK_ONLY:",&pchSourceObj,
                                   (char (*) [3])0x67d1ff);
                        linkerProperty.field_2._M_local_buf[0] = '\0';
                        cmTarget::AppendProperty
                                  (pcVar1,&pchHeader_1,&compilerVersion,
                                   (optional<cmListFileBacktrace> *)&linkerProperty,false);
                        std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
                                  ((_Optional_payload_base<cmListFileBacktrace> *)&linkerProperty);
                        std::__cxx11::string::~string((string *)&compilerVersion);
                        std::__cxx11::string::~string((string *)&pchHeader_1);
                        cmGeneratorTarget::ClearLinkInterfaceCache(target);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&linkerProperty,"LINK_FLAGS_",
                                 (allocator<char> *)&pchHeader);
                      TVar11 = cmGeneratorTarget::GetType(target);
                      if (TVar11 == STATIC_LIBRARY) {
                        std::__cxx11::string::assign((char *)&linkerProperty);
                      }
                      pcVar1 = target->Target;
                      pchHeader._M_dataplus._M_p = (pointer)linkerProperty._M_string_length;
                      pchHeader._M_string_length = (size_type)linkerProperty._M_dataplus._M_p;
                      err._M_dataplus._M_p = (pointer)configUpper._M_string_length;
                      err._M_string_length = (size_type)configUpper._M_dataplus._M_p;
                      cmStrCat<>(&local_298,(cmAlphaNum *)&pchHeader,(cmAlphaNum *)&err);
                      pchHeader_1._M_dataplus._M_p = &DAT_00000001;
                      pchHeader_1._M_string_length = (long)"\'\nfailed with:\n " + 0xf;
                      source._M_str = pchSourceObj._M_dataplus._M_p;
                      source._M_len = pchSourceObj._M_string_length;
                      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                                (&local_238,&this->super_cmOutputConverter,source,SHELL);
                      compilerVersion._M_dataplus._M_p = (pointer)local_238._M_string_length;
                      compilerVersion._M_string_length = (size_type)local_238._M_dataplus._M_p;
                      cmStrCat<>(&local_50,(cmAlphaNum *)&pchHeader_1,(cmAlphaNum *)&compilerVersion
                                );
                      local_218._M_engaged = false;
                      cmTarget::AppendProperty
                                (pcVar1,&local_298,&local_50,
                                 (optional<cmListFileBacktrace> *)&local_218,true);
                      std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_218);
                      std::__cxx11::string::~string((string *)&local_50);
                      std::__cxx11::string::~string((string *)&local_238);
                      std::__cxx11::string::~string((string *)&local_298);
                      std::__cxx11::string::~string((string *)&linkerProperty);
                    }
                    this_00 = (cmAlphaNum *)&pchSourceObj;
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&pchHeader,"PCH_EXTENSION",(allocator<char> *)&err);
                  cmSourceFile::SetProperty(pcVar13,&pchHeader,cVar12);
                  this_00 = (cmAlphaNum *)&pchHeader;
                }
                std::__cxx11::string::~string((string *)this_00);
                pcVar13 = cmMakefile::GetOrCreateSource(this->Makefile,&pchHeader_2,false,Known);
                err._M_dataplus._M_p = (pointer)&err.field_2;
                err._M_string_length = 0;
                err.field_2._M_local_buf[0] = '\0';
                cmSourceFile::ResolveFullPath(pcVar13,&err,(string *)0x0);
                if (err._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pchHeader);
                  poVar16 = std::operator<<((ostream *)&pchHeader,
                                            "Unable to resolve full path of PCH-header \'");
                  poVar16 = std::operator<<(poVar16,(string *)&pchHeader_2);
                  poVar16 = std::operator<<(poVar16,"\' assigned to target ");
                  psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                  poVar16 = std::operator<<(poVar16,(string *)psVar14);
                  std::operator<<(poVar16,", although its path is supposed to be known!");
                  std::__cxx11::stringbuf::str();
                  IssueMessage(this,FATAL_ERROR,&pchHeader_1);
                  std::__cxx11::string::~string((string *)&pchHeader_1);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pchHeader);
                }
                cmGeneratorTarget::AddSource(target,&pchHeader_2,false);
                std::__cxx11::string::~string((string *)&err);
                std::__cxx11::string::~string((string *)&pchFile);
              }
            }
          }
          std::__cxx11::string::~string((string *)&pchHeader_2);
          std::__cxx11::string::~string((string *)&useMultiArchPch);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&architectures);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&pchLangSet._M_t);
    std::__cxx11::string::~string((string *)&configUpper);
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configsList);
  return;
}

Assistant:

void cmLocalGenerator::AddPchDependencies(cmGeneratorTarget* target)
{
  std::vector<std::string> configsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& config : configsList) {
    // FIXME: Refactor collection of sources to not evaluate object
    // libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, config);

    const std::string configUpper = cmSystemTools::UpperCase(config);
    static const std::array<std::string, 4> langs = { { "C", "CXX", "OBJC",
                                                        "OBJCXX" } };

    std::set<std::string> pchLangSet;
    if (this->GetGlobalGenerator()->IsXcode()) {
      for (const std::string& lang : langs) {
        const std::string pchHeader = target->GetPchHeader(config, lang, "");
        if (!pchHeader.empty()) {
          pchLangSet.emplace(lang);
        }
      }
    }

    for (const std::string& lang : langs) {
      auto langSources = std::count_if(
        sources.begin(), sources.end(), [lang](cmSourceFile* sf) {
          return lang == sf->GetLanguage() &&
            !sf->GetProperty("SKIP_PRECOMPILE_HEADERS");
        });
      if (langSources == 0) {
        continue;
      }

      std::vector<std::string> architectures;
      if (!this->GetGlobalGenerator()->IsXcode()) {
        target->GetAppleArchs(config, architectures);
      }
      if (architectures.empty()) {
        architectures.emplace_back();
      } else {
        std::string useMultiArchPch;
        for (const std::string& arch : architectures) {
          const std::string pchHeader =
            target->GetPchHeader(config, lang, arch);
          if (!pchHeader.empty()) {
            useMultiArchPch = cmStrCat(useMultiArchPch, ";-Xarch_", arch,
                                       ";-include", pchHeader);
          }
        }

        if (!useMultiArchPch.empty()) {

          target->Target->AppendProperty(
            cmStrCat(lang, "_COMPILE_OPTIONS_USE_PCH"),
            cmStrCat("$<$<CONFIG:", config, ">:", useMultiArchPch, ">"));
        }
      }

      for (const std::string& arch : architectures) {
        const std::string pchSource = target->GetPchSource(config, lang, arch);
        const std::string pchHeader = target->GetPchHeader(config, lang, arch);

        if (pchSource.empty() || pchHeader.empty()) {
          if (this->GetGlobalGenerator()->IsXcode() && !pchLangSet.empty()) {
            for (auto* sf : sources) {
              const auto sourceLanguage = sf->GetLanguage();
              if (!sourceLanguage.empty() &&
                  pchLangSet.find(sourceLanguage) == pchLangSet.end()) {
                sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
              }
            }
          }
          continue;
        }

        cmValue pchExtension =
          this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

        if (pchExtension.IsEmpty()) {
          continue;
        }

        cmValue ReuseFrom =
          target->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

        auto* pch_sf = this->Makefile->GetOrCreateSource(
          pchSource, false, cmSourceFileLocationKind::Known);

        if (!this->GetGlobalGenerator()->IsXcode()) {
          if (!ReuseFrom) {
            target->AddSource(pchSource, true);
          }

          const std::string pchFile = target->GetPchFile(config, lang, arch);

          // Exclude the pch files from linking
          if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
            if (!ReuseFrom) {
              pch_sf->AppendProperty(
                "OBJECT_OUTPUTS",
                cmStrCat("$<$<CONFIG:", config, ">:", pchFile, ">"));
            } else {
              auto* reuseTarget =
                this->GlobalGenerator->FindGeneratorTarget(*ReuseFrom);

              if (this->Makefile->IsOn("CMAKE_PCH_COPY_COMPILE_PDB")) {

                const std::string compilerId =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

                const std::string compilerVersion =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"));

                const std::string langFlags =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_FLAGS_", configUpper));

                bool editAndContinueDebugInfo = false;
                bool programDatabaseDebugInfo = false;
                if (cm::optional<std::string> msvcDebugInformationFormat =
                      this->GetMSVCDebugFormatName(config, target)) {
                  editAndContinueDebugInfo =
                    *msvcDebugInformationFormat == "EditAndContinue";
                  programDatabaseDebugInfo =
                    *msvcDebugInformationFormat == "ProgramDatabase";
                } else {
                  editAndContinueDebugInfo =
                    langFlags.find("/ZI") != std::string::npos ||
                    langFlags.find("-ZI") != std::string::npos;
                  programDatabaseDebugInfo =
                    langFlags.find("/Zi") != std::string::npos ||
                    langFlags.find("-Zi") != std::string::npos;
                }

                // MSVC 2008 is producing both .pdb and .idb files with /Zi.
                bool msvc2008OrLess =
                  cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                                compilerVersion, "16.0") &&
                  compilerId == "MSVC";
                // but not when used via toolset -Tv90
                if (this->Makefile->GetSafeDefinition(
                      "CMAKE_VS_PLATFORM_TOOLSET") == "v90") {
                  msvc2008OrLess = false;
                }

                if (editAndContinueDebugInfo || msvc2008OrLess) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb", ".idb" });
                } else if (programDatabaseDebugInfo) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb" });
                }
              }

              // Link to the pch object file
              std::string pchSourceObj =
                reuseTarget->GetPchFileObject(config, lang, arch);

              if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
                std::string linkerProperty = "LINK_FLAGS_";
                if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
                  linkerProperty = "STATIC_LIBRARY_FLAGS_";
                }
                target->Target->AppendProperty(
                  cmStrCat(linkerProperty, configUpper),
                  cmStrCat(" ",
                           this->ConvertToOutputFormat(pchSourceObj, SHELL)),
                  cm::nullopt, true);
              } else if (reuseTarget->GetType() ==
                         cmStateEnums::OBJECT_LIBRARY) {
                // FIXME: This can propagate more than one level, unlike
                // the rest of the object files in an object library.
                // Find another way to do this.
                target->Target->AppendProperty(
                  "INTERFACE_LINK_LIBRARIES",
                  cmStrCat("$<$<CONFIG:", config,
                           ">:$<LINK_ONLY:", pchSourceObj, ">>"));
                // We updated the link interface, so ensure it is recomputed.
                target->ClearLinkInterfaceCache();
              }
            }
          } else {
            pch_sf->SetProperty("PCH_EXTENSION", pchExtension);
          }

          // Add pchHeader to source files, which will
          // be grouped as "Precompile Header File"
          auto* pchHeader_sf = this->Makefile->GetOrCreateSource(
            pchHeader, false, cmSourceFileLocationKind::Known);
          std::string err;
          pchHeader_sf->ResolveFullPath(&err);
          if (!err.empty()) {
            std::ostringstream msg;
            msg << "Unable to resolve full path of PCH-header '" << pchHeader
                << "' assigned to target " << target->GetName()
                << ", although its path is supposed to be known!";
            this->IssueMessage(MessageType::FATAL_ERROR, msg.str());
          }
          target->AddSource(pchHeader);
        }
      }
    }
  }
}